

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void inlet_symbol(_inlet *x,t_symbol *s)

{
  t_pd *pp_Var1;
  t_symbol *ptVar2;
  t_gotfn p_Var3;
  undefined1 local_28 [8];
  t_atom a;
  t_symbol *s_local;
  _inlet *x_local;
  
  a.a_w.w_symbol = s;
  if (x->i_symfrom == &s_symbol) {
    pd_vmess(x->i_dest,(x->i_un).iu_symto,"s",s);
  }
  else if (x->i_symfrom == (t_symbol *)0x0) {
    pd_symbol(x->i_dest,s);
  }
  else if (x->i_symfrom == &s_list) {
    local_28._0_4_ = A_SYMBOL;
    a._0_8_ = s;
    inlet_list(x,&s_symbol,1,(t_atom *)local_28);
  }
  else {
    if (x->i_symfrom == &s_signal) {
      pp_Var1 = x->i_dest;
      ptVar2 = gensym("fwd");
      p_Var3 = zgetfn(pp_Var1,ptVar2);
      if (p_Var3 != (t_gotfn)0x0) {
        pp_Var1 = x->i_dest;
        ptVar2 = gensym("fwd");
        pd_vmess(pp_Var1,ptVar2,"ss",&s_symbol,a.a_w.w_symbol);
        return;
      }
    }
    inlet_wrong(x,&s_symbol);
  }
  return;
}

Assistant:

static void inlet_symbol(t_inlet *x, t_symbol *s)
{
    if (x->i_symfrom == &s_symbol)
        pd_vmess(x->i_dest, x->i_symto, "s", s);
    else if (!x->i_symfrom) pd_symbol(x->i_dest, s);
    else if (x->i_symfrom == &s_list)
    {
        t_atom a;
        SETSYMBOL(&a, s);
        inlet_list(x, &s_symbol, 1, &a);
    }
    else if (x->i_symfrom == &s_signal && zgetfn(x->i_dest, gensym("fwd")))
        vmess(x->i_dest, gensym("fwd"), "ss", &s_symbol, s);
    else inlet_wrong(x, &s_symbol);
}